

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_engine.cpp
# Opt level: O3

uint64_t __thiscall duckdb::RandomEngine::NextRandomInteger64(RandomEngine *this)

{
  ulong uVar1;
  pointer pRVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  
  pRVar2 = unique_ptr<duckdb::RandomState,_std::default_delete<duckdb::RandomState>,_true>::
           operator->(&this->random_state);
  uVar1 = (pRVar2->pcg).state_;
  (pRVar2->pcg).state_ =
       uVar1 * 0x5851f42d4c957f2d + (pRVar2->pcg).super_specific_stream<unsigned_long>.inc_;
  uVar6 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
  bVar3 = (byte)(uVar1 >> 0x3b);
  pRVar2 = unique_ptr<duckdb::RandomState,_std::default_delete<duckdb::RandomState>,_true>::
           operator->(&this->random_state);
  uVar1 = (pRVar2->pcg).state_;
  uVar5 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
  bVar4 = (byte)(uVar1 >> 0x3b);
  (pRVar2->pcg).state_ =
       uVar1 * 0x5851f42d4c957f2d + (pRVar2->pcg).super_specific_stream<unsigned_long>.inc_;
  return CONCAT44(uVar6 >> bVar3 | uVar6 << 0x20 - bVar3,uVar5 >> bVar4 | uVar5 << 0x20 - bVar4);
}

Assistant:

uint64_t RandomEngine::NextRandomInteger64() {
	return (static_cast<uint64_t>(NextRandomInteger()) << UINT64_C(32)) | static_cast<uint64_t>(NextRandomInteger());
}